

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PermutazioneST.cpp
# Opt level: O2

uint __thiscall PermutazioneST::numeroInversioni(PermutazioneST *this,PermutazioneST *p)

{
  ushort uVar1;
  unsigned_short *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = (p->super_Permutazione).dimensione;
  puVar2 = (p->super_Permutazione).individuo;
  uVar4 = 1;
  if (1 < uVar1) {
    uVar4 = (uint)uVar1;
  }
  uVar6 = 1;
  uVar3 = 0;
  for (uVar5 = 0; uVar7 = uVar6, uVar5 != uVar4 - 1; uVar5 = uVar5 + 1) {
    for (; uVar7 < uVar1; uVar7 = uVar7 + 1) {
      uVar3 = uVar3 + (puVar2[uVar7] < puVar2[uVar5]);
    }
    uVar6 = uVar6 + 1;
  }
  return uVar3;
}

Assistant:

unsigned int PermutazioneST::numeroInversioni(PermutazioneST& p) {

	unsigned int inv = 0;

	for (unsigned short i = 0; i < p.dimensione - 1; i++) {
		for (unsigned short j = i + 1; j < p.dimensione; j++) {
			if (p.individuo[i] > p.individuo[j])
				inv++;
		}
	}

	return inv;
}